

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cc
# Opt level: O2

void __thiscall Database::Database(Database *this,string *dir,int id)

{
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  this->id = id;
  (this->file_prefix)._M_dataplus._M_p = (pointer)&(this->file_prefix).field_2;
  (this->file_prefix)._M_string_length = 0;
  (this->file_prefix).field_2._M_local_buf[0] = '\0';
  pthread_rwlock_init((pthread_rwlock_t *)this,(pthread_rwlockattr_t *)0x0);
  std::operator+(&local_60,dir,".");
  std::__cxx11::to_string(&local_80,id);
  std::operator+(&local_40,&local_60,&local_80);
  std::__cxx11::string::operator=((string *)&this->file_prefix,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  initIndex(this);
  initSlices(this);
  return;
}

Assistant:

Database::Database(const std::string &dir, int id): id(id) {
    pthread_rwlock_init(&rwlock, nullptr);
    file_prefix = dir + "." + std::to_string(id);
//    printf("Database shard %d initing...\n", id);
    initIndex();
    initSlices();
}